

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

double __thiscall HighsDomain::doChangeBound(HighsDomain *this,HighsDomainChange *boundchg)

{
  HighsInt *__args;
  double newbound;
  int col;
  pointer pdVar1;
  pointer puVar2;
  iterator __position;
  long lVar3;
  double local_18;
  
  __args = &boundchg->column;
  col = boundchg->column;
  lVar3 = (long)col;
  newbound = boundchg->boundval;
  if (boundchg->boundtype == kLower) {
    pdVar1 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_18 = pdVar1[lVar3];
    pdVar1[lVar3] = newbound;
    if ((local_18 == newbound) && (!NAN(local_18) && !NAN(newbound))) {
      return local_18;
    }
    if (this->infeasible_ != false) goto LAB_002957e0;
    updateActivityLbChange(this,col,local_18,newbound);
  }
  else {
    pdVar1 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_18 = pdVar1[lVar3];
    pdVar1[lVar3] = newbound;
    if ((local_18 == newbound) && (!NAN(local_18) && !NAN(newbound))) {
      return local_18;
    }
    if (this->infeasible_ != false) goto LAB_002957e0;
    updateActivityUbChange(this,col,local_18,newbound);
  }
  lVar3 = (long)*__args;
LAB_002957e0:
  puVar2 = (this->changedcolsflags_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2[lVar3] == '\0') {
    puVar2[lVar3] = '\x01';
    __position._M_current =
         (this->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->changedcols_,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      (this->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return local_18;
}

Assistant:

double HighsDomain::doChangeBound(const HighsDomainChange& boundchg) {
  double oldbound;

  if (boundchg.boundtype == HighsBoundType::kLower) {
    oldbound = col_lower_[boundchg.column];
    col_lower_[boundchg.column] = boundchg.boundval;
    if (oldbound != boundchg.boundval) {
      if (!infeasible_)
        updateActivityLbChange(boundchg.column, oldbound, boundchg.boundval);

      if (!changedcolsflags_[boundchg.column]) {
        changedcolsflags_[boundchg.column] = 1;
        changedcols_.push_back(boundchg.column);
      }
    }
  } else {
    oldbound = col_upper_[boundchg.column];
    col_upper_[boundchg.column] = boundchg.boundval;
    if (oldbound != boundchg.boundval) {
      if (!infeasible_)
        updateActivityUbChange(boundchg.column, oldbound, boundchg.boundval);

      if (!changedcolsflags_[boundchg.column]) {
        changedcolsflags_[boundchg.column] = 1;
        changedcols_.push_back(boundchg.column);
      }
    }
  }

  return oldbound;
}